

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf_v4::bone_motion_io::import(bone_motion_io *this,xr_reader *r,uint_fast32_t num_keys)

{
  byte bVar1;
  ogf_key_qr *poVar2;
  _ogf4_key_qt<short> *p_Var3;
  _ogf4_key_qt<signed_char> *p_Var4;
  _vector3<float> *value_00;
  float local_a4;
  float local_90;
  float local_84;
  ulong local_78;
  uint_fast32_t i_2;
  ogf4_key_qt *keys_qt_1;
  uint_fast32_t i_1;
  ogf4_key_qt_hq *keys_qt;
  fvector3 value;
  fvector3 t_size;
  fvector3 t_init;
  size_t i;
  uint flags;
  uint_fast32_t num_keys_local;
  xr_reader *r_local;
  bone_motion_io *this_local;
  
  xr_bone_motion::create_envelopes((xr_bone_motion *)this);
  bVar1 = xr_reader::r_u8(r);
  if ((bVar1 & 2) == 0) {
    xr_reader::r_u32(r);
    for (t_init.field_0._4_8_ = 0; t_init.field_0._4_8_ != num_keys;
        t_init.field_0._4_8_ = t_init.field_0._4_8_ + 1) {
      local_84 = (float)(ulong)t_init.field_0._4_8_;
      poVar2 = xr_reader::skip<xray_re::ogf_key_qr>(r,1);
      xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,local_84 / 30.0,poVar2);
    }
  }
  else {
    poVar2 = xr_reader::skip<xray_re::ogf_key_qr>(r,1);
    xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,0.0,poVar2);
  }
  if ((bVar1 & 1) == 0) {
    value_00 = xr_reader::skip<xray_re::_vector3<float>>(r,1);
    xr_ogf::bone_motion_io::insert_key(&this->super_bone_motion_io,0.0,value_00);
  }
  else {
    xr_reader::r_u32(r);
    if ((bVar1 & 4) == 0) {
      p_Var4 = xr_reader::skip<xray_re::_ogf4_key_qt<signed_char>>(r,num_keys);
      xr_reader::r_fvector3(r,(fvector3 *)((long)&value.field_0 + 4));
      xr_reader::r_fvector3(r,(fvector3 *)((long)&t_size.field_0 + 4));
      for (local_78 = 0; local_78 != num_keys; local_78 = local_78 + 1) {
        _ogf4_key_qt<signed_char>::dequantize
                  (p_Var4 + local_78,(fvector3 *)((long)&keys_qt + 4),
                   (fvector3 *)((long)&value.field_0 + 4));
        _vector3<float>::add
                  ((fvector3 *)((long)&keys_qt + 4),(_vector3<float> *)((long)&t_size.field_0 + 4));
        local_a4 = (float)local_78;
        xr_ogf::bone_motion_io::insert_key
                  (&this->super_bone_motion_io,local_a4 / 30.0,(fvector3 *)((long)&keys_qt + 4));
      }
    }
    else {
      p_Var3 = xr_reader::skip<xray_re::_ogf4_key_qt<short>>(r,num_keys);
      xr_reader::r_fvector3(r,(fvector3 *)((long)&value.field_0 + 4));
      xr_reader::r_fvector3(r,(fvector3 *)((long)&t_size.field_0 + 4));
      for (keys_qt_1 = (ogf4_key_qt *)0x0; keys_qt_1 != (ogf4_key_qt *)num_keys;
          keys_qt_1 = (ogf4_key_qt *)&keys_qt_1->y) {
        _ogf4_key_qt<short>::dequantize
                  (p_Var3 + (long)keys_qt_1,(fvector3 *)((long)&keys_qt + 4),
                   (fvector3 *)((long)&value.field_0 + 4));
        _vector3<float>::add
                  ((fvector3 *)((long)&keys_qt + 4),(_vector3<float> *)((long)&t_size.field_0 + 4));
        local_90 = (float)keys_qt_1;
        xr_ogf::bone_motion_io::insert_key
                  (&this->super_bone_motion_io,local_90 / 30.0,(fvector3 *)((long)&keys_qt + 4));
      }
    }
  }
  return;
}

Assistant:

void xr_ogf_v4::bone_motion_io::import(xr_reader& r, uint_fast32_t num_keys)
{
	create_envelopes();

	unsigned flags = r.r_u8();

	if (flags & KPF_R_ABSENT) {
		insert_key(0, r.skip<ogf_key_qr>());
	} else {
		r.r_u32();
		for (size_t i = 0; i != num_keys; ++i)
			insert_key(i/OGF4_MOTION_FPS, r.skip<ogf_key_qr>());
	}
	if (flags & KPF_T_PRESENT) {
		r.r_u32();
		fvector3 t_init, t_size, value;
		if (flags & KPF_T_HQ) {
			const ogf4_key_qt_hq* keys_qt = r.skip<ogf4_key_qt_hq>(num_keys);
			r.r_fvector3(t_size);
			r.r_fvector3(t_init);
			for (uint_fast32_t i = 0; i != num_keys; ++i) {
				keys_qt[i].dequantize(value, t_size);
				value.add(t_init);
				insert_key(float(i)/OGF4_MOTION_FPS, &value);
			}
		} else {
			const ogf4_key_qt* keys_qt = r.skip<ogf4_key_qt>(num_keys);
			r.r_fvector3(t_size);
			r.r_fvector3(t_init);
			for (uint_fast32_t i = 0; i != num_keys; ++i) {
				keys_qt[i].dequantize(value, t_size);
				value.add(t_init);
				insert_key(float(i)/OGF4_MOTION_FPS, &value);
			}
		}
	} else {
		insert_key(0, r.skip<fvector3>());
	}
}